

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

int64_t absl::lts_20250127::IDivDuration(Duration num,Duration den,Duration *rem)

{
  int iVar1;
  HiRep HVar2;
  ulong uVar3;
  int64_t iVar4;
  uint32_t uVar5;
  uint uVar6;
  HiRep HVar7;
  HiRep HVar8;
  ulong uVar9;
  
  uVar5 = den.rep_lo_;
  HVar7 = den.rep_hi_;
  uVar6 = num.rep_lo_;
  HVar8 = num.rep_hi_;
  if (uVar5 == 0xffffffff || uVar6 == 0xffffffff) {
LAB_004aac09:
    iVar4 = anon_unknown_1::IDivSlowPath(true,num,den,rem);
    return iVar4;
  }
  if (HVar7 == (HiRep)0x0) {
    if ((int)uVar5 < 4000) {
      if (uVar5 == 4) {
        if (0x225c17c < (ulong)HVar8 >> 8) goto LAB_004aac09;
        HVar2 = (HiRep)((ulong)(uVar6 >> 2) + (long)HVar8 * 1000000000);
        uVar6 = uVar6 & 3;
        goto LAB_004aabfc;
      }
      if ((uVar5 != 400) || (0xd6bf94d454 < (ulong)HVar8)) goto LAB_004aac09;
      HVar2 = (HiRep)((long)HVar8 * 10000000 + (ulong)uVar6 / 400);
      iVar1 = (uVar6 / 400) * 400;
    }
    else if (uVar5 == 4000) {
      if (0x8637bd04b55 < (ulong)HVar8) goto LAB_004aac09;
      HVar2 = (HiRep)((long)HVar8 * 1000000 + (ulong)uVar6 / 4000);
      iVar1 = (uVar6 / 4000) * 4000;
    }
    else {
      if ((uVar5 != 4000000) || (0x20c49ba5a64af6 < (ulong)HVar8)) goto LAB_004aac09;
      HVar2 = (HiRep)((long)HVar8 * 1000 + (ulong)uVar6 / 4000000);
      iVar1 = (uVar6 / 4000000) * 4000000;
    }
    uVar6 = uVar6 - iVar1;
  }
  else {
    if (uVar5 != 0 || (long)HVar7 < 1) goto LAB_004aac09;
    if ((long)HVar8 < 0) {
      uVar3 = -((ulong)(uVar6 != 0) + (long)HVar8);
      uVar9 = uVar3 % (ulong)HVar7;
      HVar8 = (HiRep)~uVar9;
      if (uVar6 == 0) {
        HVar8 = (HiRep)-uVar9;
      }
      HVar2 = (HiRep)-(uVar3 / (ulong)HVar7);
      goto LAB_004aabfe;
    }
    HVar2 = HVar8;
    if (HVar7 != (HiRep)0x1) {
      HVar2 = (HiRep)((ulong)HVar8 / (ulong)HVar7);
      HVar8 = (HiRep)((ulong)HVar8 % (ulong)HVar7);
      goto LAB_004aabfe;
    }
  }
LAB_004aabfc:
  HVar8.lo_ = 0;
  HVar8.hi_ = 0;
LAB_004aabfe:
  rem->rep_hi_ = HVar8;
  rem->rep_lo_ = uVar6;
  return (int64_t)HVar2;
}

Assistant:

int64_t IDivDuration(Duration num, Duration den, Duration* rem) {
  return IDivDurationImpl(true, num, den,
                          rem);  // trunc towards zero
}